

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_compress.c
# Opt level: O3

void test_write_filter_compress(void)

{
  int iVar1;
  wchar_t wVar2;
  void *buff;
  void *buff_00;
  archive *paVar3;
  archive_entry *entry;
  ssize_t v2;
  char *v2_00;
  int64_t v2_01;
  ulong uVar4;
  uint uVar5;
  archive_entry *ae;
  size_t used;
  char path [16];
  archive_entry *local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  char local_48 [24];
  
  buff = malloc(1000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                   ,L'/',(uint)(buff != (void *)0x0),"NULL != (buff = (char *)malloc(buffsize))",
                   (void *)0x0);
  buff_00 = calloc(1,10000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                   ,L'2',(uint)(buff_00 != (void *)0x0),"NULL != (data = (char *)malloc(datasize))",
                   (void *)0x0);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                   ,L'5',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar3);
  wVar2 = archive_write_add_filter_compress(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'9',0,"ARCHIVE_OK",(long)wVar2,"archive_write_add_filter_compress(a)",paVar3
                     );
  local_60 = buff;
  iVar1 = archive_write_open_memory(paVar3,buff,1000000,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L';',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",paVar3);
  uVar4 = 0;
  do {
    sprintf(local_48,"file%03d",uVar4);
    entry = archive_entry_new();
    local_68 = entry;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                     ,L'?',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(entry,local_48);
    archive_entry_set_size(entry,10000);
    archive_entry_set_filetype(entry,0x8000);
    iVar1 = archive_write_header(paVar3,entry);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                        ,L'C',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
    v2 = archive_write_data(paVar3,buff_00,10000);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                        ,L'E',10000,"datasize",v2,"archive_write_data(a, data, datasize)",
                        (void *)0x0);
    archive_entry_free(entry);
    uVar5 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar5;
  } while (uVar5 != 100);
  local_58 = buff_00;
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                   ,L'O',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,local_60,local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      paVar3);
  uVar4 = 0;
  do {
    sprintf(local_48,"file%03d",uVar4);
    iVar1 = archive_read_next_header(paVar3,&local_68);
    wVar2 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                                ,L'W',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",
                                (void *)0x0);
    if (wVar2 == L'\0') break;
    v2_00 = archive_entry_pathname(local_68);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
               ,L'Y',local_48,"path",v2_00,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    v2_01 = archive_entry_size(local_68);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                        ,L'Z',10000,"(int)datasize",v2_01,"archive_entry_size(ae)",(void *)0x0);
    uVar5 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar5;
  } while (uVar5 != 100);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_filter_compress.c"
                      ,L']',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free(local_58);
  free(local_60);
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_compress)
{
	struct archive_entry *ae;
	struct archive* a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used;
	int i;

	buffsize = 1000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	memset(data, 0, datasize);

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_compress(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertEqualInt(datasize,
		    archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));


	for (i = 0; i < 100; i++) {
		sprintf(path, "file%03d", i);
		if (!assertEqualInt(0, archive_read_next_header(a, &ae)))
			break;
		assertEqualString(path, archive_entry_pathname(ae));
		assertEqualInt((int)datasize, archive_entry_size(ae));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(data);
	free(buff);
}